

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void xmlHashScanFull3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                     xmlHashScannerFull f,void *data)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  long lVar3;
  _xmlHashEntry *p_Var4;
  
  if (((f != (xmlHashScannerFull)0x0 && table != (xmlHashTablePtr)0x0) &&
      (table->table != (_xmlHashEntry *)0x0)) && (0 < table->size)) {
    lVar3 = 0;
    do {
      p_Var4 = table->table;
      if (p_Var4 != (_xmlHashEntry *)0x0 && p_Var4[lVar3].valid != 0) {
        p_Var4 = p_Var4 + lVar3;
        do {
          p_Var1 = p_Var4->next;
          if (name == (xmlChar *)0x0) {
LAB_0014a0b3:
            if (name2 != (xmlChar *)0x0) {
              iVar2 = xmlStrEqual(name2,p_Var4->name2);
              if (iVar2 == 0) goto LAB_0014a0fb;
            }
            if (name3 != (xmlChar *)0x0) {
              iVar2 = xmlStrEqual(name3,p_Var4->name3);
              if (iVar2 == 0) goto LAB_0014a0fb;
            }
            if (p_Var4->payload != (void *)0x0) {
              (*f)(p_Var4->payload,data,p_Var4->name,p_Var4->name2,p_Var4->name3);
            }
          }
          else {
            iVar2 = xmlStrEqual(name,p_Var4->name);
            if (iVar2 != 0) goto LAB_0014a0b3;
          }
LAB_0014a0fb:
          p_Var4 = p_Var1;
        } while (p_Var1 != (_xmlHashEntry *)0x0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < table->size);
  }
  return;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr table, const xmlChar *name,
		 const xmlChar *name2, const xmlChar *name3,
		 xmlHashScannerFull f, void *data) {
    int i;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
		if (((name == NULL) || (xmlStrEqual(name, iter->name))) &&
		    ((name2 == NULL) || (xmlStrEqual(name2, iter->name2))) &&
		    ((name3 == NULL) || (xmlStrEqual(name3, iter->name3))) &&
		    (iter->payload != NULL)) {
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
		}
		iter = next;
	    }
	}
    }
}